

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

lys_module *
ly_ctx_load_sub_module
          (ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
          unres_schema *unres)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  LY_ERR *pLVar4;
  lys_module *plVar5;
  char *pcVar6;
  char **ppcVar7;
  lys_module *plVar8;
  int *piVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  lys_revision *plVar14;
  lys_module *plVar15;
  ulong uVar16;
  lys_module local_1088 [22];
  ly_ctx *local_88;
  unres_schema *local_80;
  lys_module *local_78;
  LYS_INFORMAT local_6c;
  char *pcStack_68;
  LYS_INFORMAT format_1;
  lys_module *local_60;
  lys_module *local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  LYS_INFORMAT format;
  int local_34;
  
  local_80 = unres;
  local_60 = module;
  local_50 = name;
  local_48 = revision;
  local_34 = implement;
  if (module == (lys_module *)0x0) {
    ppcVar7 = &internal_modules[0].revision;
    for (uVar16 = 0; uVar13 = (ulong)ctx->internal_module_count, uVar16 < uVar13;
        uVar16 = uVar16 + 1) {
      iVar3 = ly_strequal_(local_50,((internal_modules_s *)(ppcVar7 + -1))->name);
      if ((iVar3 != 0) &&
         ((local_48 == (char *)0x0 || (iVar3 = ly_strequal_(local_48,*ppcVar7), iVar3 != 0)))) {
        plVar5 = ly_ctx_get_module(ctx,local_50,local_48,0);
        return plVar5;
      }
      ppcVar7 = ppcVar7 + 4;
    }
    plVar5 = (lys_module *)0x0;
    for (; local_78 = plVar5, (long)uVar13 < (long)(ctx->models).used; uVar13 = uVar13 + 1) {
      plVar8 = (ctx->models).list[uVar13];
      iVar3 = ly_strequal_(local_50,plVar8->name);
      if (iVar3 != 0) {
        plVar15 = plVar8;
        if ((((plVar5 != (lys_module *)0x0) && (plVar15 = plVar5, plVar8->rev_size != '\0')) &&
            (plVar5->rev_size != '\0')) &&
           (iVar3 = strcmp(plVar8->rev->date,plVar5->rev->date), plVar15 = plVar8, iVar3 < 1)) {
          plVar15 = plVar5;
        }
        iVar3 = local_34;
        if (local_48 == (char *)0x0) {
          uVar1 = *(uint *)&plVar8->field_0x40;
          if ((uVar1 >> 8 & 1) != 0) goto LAB_0010c7dd;
        }
        else if ((plVar8->rev_size != '\0') &&
                (iVar2 = strcmp(local_48,plVar8->rev->date), iVar2 == 0)) {
          uVar1 = (uint)*(ushort *)&plVar8->field_0x40;
          goto LAB_0010c7dd;
        }
        plVar5 = plVar15;
        if ((iVar3 != 0) &&
           ((local_48 == (char *)0x0 &&
            (uVar1 = (uint)*(ushort *)&plVar8->field_0x40, iVar3 = local_34,
            (*(ushort *)&plVar8->field_0x40 & 0x80) != 0)))) {
LAB_0010c7dd:
          if ((uVar1 & 0x40) != 0) {
            lys_set_enabled(plVar8);
          }
          if (iVar3 == 0) {
            return plVar8;
          }
          iVar3 = lys_set_implemented(plVar8);
          if (iVar3 == 0) {
            return plVar8;
          }
          return (lys_module *)0x0;
        }
      }
    }
  }
  else {
    local_78 = (lys_module *)0x0;
  }
  uVar1 = (ctx->models).flags;
  iVar3 = local_34;
  if (ctx->imp_clb != (ly_module_imp_clb)0x0 && (uVar1 & 0x20) == 0) goto LAB_0010c812;
  do {
    if ((uVar1 & 8) == 0) {
      local_40 = (lys_module *)0x0;
      ppcVar7 = ly_ctx_get_searchdirs(ctx);
      iVar2 = lys_search_localfile
                        (ppcVar7,(uint)(((ctx->models).flags & 0x10) == 0),local_50,local_48,
                         (char **)&local_40,&local_6c);
      plVar5 = (lys_module *)0x0;
      if (iVar2 != 0) goto LAB_0010c951;
      if (local_40 == (lys_module *)0x0) {
        if ((local_60 != (lys_module *)0x0 || local_48 != (char *)0x0) ||
           (plVar5 = ly_ctx_get_module(ctx,local_50,(char *)0x0,0), plVar5 == (lys_module *)0x0)) {
          ly_log(ctx,LY_LLERR,LY_ESYS,"Data model \"%s\" not found.",local_50);
          goto LAB_0010c95f;
        }
        goto LAB_0010c96c;
      }
      uVar16 = 0;
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Loading schema from \"%s\" file.");
      pcStack_68 = strrchr((char *)local_40,0x2e);
      pcStack_68[1] = '\0';
      if (local_48 == (char *)0x0) {
        uVar1 = (ctx->models).used;
        local_58 = local_40;
        local_88 = ctx;
        uVar13 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar13 = uVar16;
        }
        for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
          plVar5 = (ctx->models).list[uVar16];
          pcVar6 = plVar5->filepath;
          if ((pcVar6 != (char *)0x0) &&
             (iVar3 = strcmp(local_50,plVar5->name), plVar8 = local_58, iVar3 == 0)) {
            sVar11 = strlen((char *)local_58);
            ctx = local_88;
            iVar2 = strncmp((char *)plVar8,pcVar6,sVar11);
            iVar3 = local_34;
            if (iVar2 == 0) {
              if ((local_34 == 0) || ((*(ushort *)&plVar5->field_0x40 & 0x80) != 0)) {
                if ((*(ushort *)&plVar5->field_0x40 & 0x40) != 0) {
                  lys_set_enabled(plVar5);
                }
              }
              else {
                iVar2 = lys_set_implemented(plVar5);
                if (iVar2 != 0) {
                  plVar5 = (lys_module *)0x0;
                }
              }
              goto LAB_0010c951;
            }
          }
        }
      }
      pcStack_68[1] = 'y';
      iVar2 = open((char *)local_40,0);
      iVar3 = local_34;
      plVar5 = local_40;
      if (iVar2 < 0) {
        piVar9 = __errno_location();
        pcVar6 = strerror(*piVar9);
        ly_log(ctx,LY_LLERR,LY_ESYS,"Unable to open data model file \"%s\" (%s).",plVar5,pcVar6);
        plVar5 = (lys_module *)0x0;
        iVar3 = local_34;
      }
      else {
        if (local_60 == (lys_module *)0x0) {
          plVar8 = lys_parse_fd_(ctx,iVar2,local_6c,local_48,local_34);
        }
        else {
          plVar8 = (lys_module *)lys_sub_parse_fd(local_60,iVar2,local_6c,local_80);
        }
        close(iVar2);
        plVar15 = local_40;
        plVar5 = (lys_module *)0x0;
        if (plVar8 != (lys_module *)0x0) {
          pcVar6 = strrchr((char *)local_40,0x2f);
          plVar5 = (lys_module *)(pcVar6 + 1);
          if (pcVar6 == (char *)0x0) {
            plVar5 = plVar15;
          }
          pcVar10 = strchr((char *)plVar5,0x40);
          pcVar6 = plVar8->name;
          local_58 = plVar8;
          sVar11 = strlen(pcVar6);
          iVar3 = strncmp((char *)plVar5,pcVar6,sVar11);
          if (iVar3 == 0) {
            pcVar12 = pcVar10;
            if (pcVar10 == (char *)0x0) {
              pcVar12 = pcStack_68;
            }
            if (plVar5->padding2 + (sVar11 - 0x42) != (uint8_t *)pcVar12) goto LAB_0010cb93;
          }
          else {
LAB_0010cb93:
            ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module name \"%s\".",
                   plVar5,pcVar6);
          }
          iVar3 = local_34;
          if (pcVar10 != (char *)0x0) {
            if ((local_58->rev_size == '\0') || ((long)pcStack_68 - (long)(pcVar10 + 1) != 10)) {
              pcVar6 = "none";
              if (local_58->rev_size != '\0') {
                pcVar6 = local_58->rev->date;
              }
            }
            else {
              pcVar6 = local_58->rev->date;
              iVar2 = strncmp(pcVar6,pcVar10 + 1,10);
              if (iVar2 == 0) goto LAB_0010cc1a;
            }
            ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module revision \"%s\"."
                   ,plVar5,pcVar6);
          }
LAB_0010cc1a:
          plVar5 = local_58;
          if (local_58->filepath == (char *)0x0) {
            pcVar6 = realpath((char *)local_40,(char *)local_1088);
            plVar8 = local_40;
            if (pcVar6 != (char *)0x0) {
              plVar8 = local_1088;
            }
            pcVar6 = lydict_insert(ctx,(char *)plVar8,0);
            plVar5->filepath = pcVar6;
          }
        }
      }
LAB_0010c951:
      free(local_40);
      if (plVar5 != (lys_module *)0x0) goto LAB_0010c96c;
    }
LAB_0010c95f:
    if (((ctx->models).flags & 0x20) == 0) break;
    if (ctx->imp_clb != (ly_module_imp_clb)0x0) {
LAB_0010c812:
      local_40 = (lys_module *)((ulong)local_40._4_4_ << 0x20);
      local_1088[0].ctx = (ly_ctx *)0x0;
      pLVar4 = ly_errno_glob_address();
      *pLVar4 = LY_SUCCESS;
      if (local_60 == (lys_module *)0x0) {
        plVar5 = (lys_module *)0x0;
        pcVar6 = (*ctx->imp_clb)(local_50,local_48,(char *)0x0,(char *)0x0,ctx->imp_clb_data,
                                 (LYS_INFORMAT *)&local_40,
                                 (_func_void_void_ptr_void_ptr **)local_1088);
        if (pcVar6 == (char *)0x0) goto LAB_0010c8e2;
        plVar5 = lys_parse_mem_(ctx,pcVar6,(LYS_INFORMAT)local_40,(char *)0x0,0,iVar3);
LAB_0010c8c8:
        if (local_1088[0].ctx != (ly_ctx *)0x0) {
          (*(code *)local_1088[0].ctx)(pcVar6);
        }
      }
      else {
        plVar5 = lys_main_module(local_60);
        plVar14 = (lys_revision *)0x0;
        if (plVar5->rev_size != '\0') {
          plVar14 = plVar5->rev;
        }
        pcVar6 = (*ctx->imp_clb)(plVar5->name,plVar14->date,local_50,local_48,ctx->imp_clb_data,
                                 (LYS_INFORMAT *)&local_40,
                                 (_func_void_void_ptr_void_ptr **)local_1088);
        if (pcVar6 != (char *)0x0) {
          plVar5 = (lys_module *)lys_sub_parse_mem(local_60,pcVar6,(LYS_INFORMAT)local_40,local_80);
          goto LAB_0010c8c8;
        }
LAB_0010c8e2:
        pLVar4 = ly_errno_glob_address();
        if (*pLVar4 != LY_SUCCESS) {
          pLVar4 = ly_errno_glob_address();
          ly_log(ctx,LY_LLERR,*pLVar4,"User module retrieval callback failed!");
          goto LAB_0010c90d;
        }
      }
      if (plVar5 != (lys_module *)0x0) goto LAB_0010c96c;
    }
LAB_0010c90d:
    uVar1 = (ctx->models).flags;
  } while ((uVar1 & 0x20) == 0);
  plVar5 = (lys_module *)0x0;
LAB_0010c96c:
  if (local_78 == (lys_module *)0x0) {
    local_78 = plVar5;
  }
  if (plVar5 != (lys_module *)0x0) {
    local_78 = plVar5;
  }
  if ((local_48 == (char *)0x0) && (local_78 != (lys_module *)0x0)) {
    local_78->field_0x41 = local_78->field_0x41 | 1;
  }
  return local_78;
}

Assistant:

const struct lys_module *
ly_ctx_load_sub_module(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                       int implement, struct unres_schema *unres)
{
    struct lys_module *mod = NULL, *latest_mod = NULL;
    int i;

    if (!module) {
        /* exception for internal modules */
        for (i = 0; i < ctx->internal_module_count; i++) {
            if (ly_strequal(name, internal_modules[i].name, 0)) {
                if (!revision || ly_strequal(revision, internal_modules[i].revision, 0)) {
                    /* return internal module */
                    return (struct lys_module *)ly_ctx_get_module(ctx, name, revision, 0);
                }
            }
        }
        /* try to get the schema from the context (with or without revision),
         * include the disabled modules in the search to avoid their duplication,
         * they are enabled by the subsequent call to lys_set_implemented() */
        for (i = ctx->internal_module_count, mod = NULL; i < ctx->models.used; i++) {
            mod = ctx->models.list[i]; /* shortcut */
            if (ly_strequal(name, mod->name, 0)) {
                /* first remember latest module if no other is found */
                if (!latest_mod) {
                    latest_mod = mod;
                } else {
                    if (mod->rev_size && latest_mod->rev_size && (strcmp(mod->rev[0].date, latest_mod->rev[0].date) > 0)) {
                        /* newer revision */
                        latest_mod = mod;
                    }
                }

                if (revision && mod->rev_size && !strcmp(revision, mod->rev[0].date)) {
                    /* the specific revision was already loaded */
                    break;
                } else if (!revision && mod->latest_revision) {
                    /* the latest revision of this module was already loaded */
                    break;
                } else if (implement && mod->implemented && !revision) {
                    /* we are not able to implement another module, so consider this module as the latest one */
                    break;
                }
            }
            mod = NULL;
        }
        if (mod) {
            /* module must be enabled */
            if (mod->disabled) {
                lys_set_enabled(mod);
            }
            /* module is supposed to be implemented */
            if (implement && lys_set_implemented(mod)) {
                /* the schema cannot be implemented */
                mod = NULL;
            }
            return mod;
        }
    }

    /* module is not yet in context, use the user callback or try to find the schema on our own */
    if (ctx->imp_clb && !(ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
search_clb:
        if (ctx->imp_clb) {
            mod = ly_ctx_load_sub_module_clb(ctx, module, name, revision, implement, unres);
        }
        if (!mod && !(ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
            goto search_file;
        }
    } else {
search_file:
        if (!(ctx->models.flags & LY_CTX_DISABLE_SEARCHDIRS)) {
            /* module was not received from the callback or there is no callback set */
            mod = ly_ctx_load_localfile(ctx, module, name, revision, implement, unres);
        }
        if (!mod && (ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
            goto search_clb;
        }
    }

    if (!mod && latest_mod) {
        /* consider the latest mod found as the latest available */
        mod = latest_mod;
    }

#ifdef LY_ENABLED_LATEST_REVISIONS
    if (!revision && mod) {
        /* module is the latest revision found */
        mod->latest_revision = 1;
    }
#endif

    return mod;
}